

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionOffer.cpp
# Opt level: O0

void __thiscall ki::protocol::control::SessionOffer::read_from(SessionOffer *this,istream *istream)

{
  unsigned_short uVar1;
  int iVar2;
  uint uVar3;
  Field<unsigned_short> *pFVar4;
  Field<int> *pFVar5;
  Field<unsigned_int> *pFVar6;
  ostringstream oss;
  parse_error *e;
  string local_128 [32];
  Field<unsigned_int> *local_108;
  Field<unsigned_int> *milliseconds;
  string local_f8 [32];
  Field<int> *local_d8;
  Field<int> *timestamp;
  string local_c8 [55];
  allocator local_91;
  string local_90 [32];
  Field<unsigned_short> *local_70;
  Field<unsigned_short> *session_id;
  Record record;
  istream *istream_local;
  SessionOffer *this_local;
  
  record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)istream;
  ki::dml::Record::Record((Record *)&session_id);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"m_session_id",&local_91);
  pFVar4 = ki::dml::Record::add_field<unsigned_short>((Record *)&session_id,(string *)local_90,true)
  ;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_70 = pFVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"unknown",(allocator *)((long)&timestamp + 7));
  ki::dml::Record::add_field<unsigned_int>((Record *)&session_id,(string *)local_c8,true);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&timestamp + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"m_timestamp",(allocator *)((long)&milliseconds + 7));
  pFVar5 = ki::dml::Record::add_field<int>((Record *)&session_id,(string *)local_f8,true);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&milliseconds + 7));
  local_d8 = pFVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"m_milliseconds",(allocator *)((long)&e + 7));
  pFVar6 = ki::dml::Record::add_field<unsigned_int>((Record *)&session_id,(string *)local_128,true);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  local_108 = pFVar6;
  ki::dml::Record::read_from
            ((Record *)&session_id,
             (istream *)record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uVar1 = ki::dml::Field<unsigned_short>::get_value(local_70);
  this->m_session_id = uVar1;
  iVar2 = ki::dml::Field<int>::get_value(local_d8);
  this->m_timestamp = iVar2;
  uVar3 = ki::dml::Field<unsigned_int>::get_value(local_108);
  this->m_milliseconds = uVar3;
  ki::dml::Record::~Record((Record *)&session_id);
  return;
}

Assistant:

void SessionOffer::read_from(std::istream& istream)
	{
		dml::Record record;
		auto *session_id = record.add_field<dml::USHRT>("m_session_id");
		record.add_field<dml::UINT>("unknown");
		auto *timestamp = record.add_field<dml::INT>("m_timestamp");
		auto *milliseconds = record.add_field<dml::UINT>("m_milliseconds");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading SessionOffer payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_session_id = session_id->get_value();
		m_timestamp = timestamp->get_value();
		m_milliseconds = milliseconds->get_value();
	}